

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

Result __thiscall
wabt::SharedValidator::CheckIndex(SharedValidator *this,Var *var,Index max_index,char *desc)

{
  Result RVar1;
  
  if (var->type_ != Index) {
    __assert_fail("is_index()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/ir.h",
                  0x38,"Index wabt::Var::index() const");
  }
  if ((var->field_2).index_ < max_index) {
    return (Result)Ok;
  }
  RVar1 = PrintError(this,&var->loc,"%s variable out of range: %u (max %u)",desc,
                     (ulong)(var->field_2).index_,(ulong)max_index);
  return (Result)RVar1.enum_;
}

Assistant:

Index index() const { assert(is_index()); return index_; }